

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall YAML::SingleDocParser::ParseTag(SingleDocParser *this,string *tag)

{
  Token *token;
  Exception *this_00;
  Tag tagInfo;
  string local_90;
  undefined1 local_70 [40];
  _Alloc_hider local_48;
  size_type *local_38 [2];
  
  token = Scanner::peek(this->m_scanner);
  if (tag->_M_string_length == 0) {
    Tag::Tag((Tag *)local_70,token);
    Tag::Translate_abi_cxx11_(&local_90,(Tag *)local_70,this->m_directives);
    std::__cxx11::string::_M_assign((string *)tag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    Scanner::pop(this->m_scanner);
    if ((size_type **)local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
    if ((undefined1 *)local_70._8_8_ != local_70 + 0x18) {
      operator_delete((void *)local_70._8_8_);
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x40);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"cannot assign multiple tags to the same node","");
  Exception::Exception(this_00,&token->mark,(string *)local_70);
  *(undefined ***)this_00 = &PTR__BadFile_008779d0;
  __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

void SingleDocParser::ParseTag(std::string& tag) {
  Token& token = m_scanner.peek();
  if (!tag.empty())
    throw ParserException(token.mark, ErrorMsg::MULTIPLE_TAGS);

  Tag tagInfo(token);
  tag = tagInfo.Translate(m_directives);
  m_scanner.pop();
}